

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall Imf_2_5::DwaCompressor::LossyDctEncoderBase::execute(LossyDctEncoderBase *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  pointer pvVar7;
  pointer pvVar8;
  unsigned_short *puVar9;
  long lVar10;
  pointer pSVar11;
  float *pfVar12;
  float *pfVar13;
  half hVar14;
  short sVar15;
  uint uVar16;
  uint uVar17;
  __m128 *srcVec;
  long lVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  half *phVar21;
  int x;
  uint uVar22;
  long lVar23;
  LossyDctEncoderBase *pLVar24;
  float *pfVar25;
  int iVar26;
  int i;
  uint uVar27;
  ulong uVar28;
  LossyDctEncoderBase *pLVar29;
  LossyDctEncoderBase *this_00;
  ushort uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int y;
  _func_int **pp_Var34;
  bool bVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  uchar b [4];
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> currDcComp;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpHalfBuffer;
  unsigned_short *currAcComp;
  half halfCoef [64];
  half halfZigCoef [64];
  float local_1d8;
  uint local_1d4;
  _func_int **local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  pointer local_1b8;
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  *local_1b0;
  unsigned_short *local_1a8;
  pointer local_1a0;
  _func_int **local_198;
  LossyDctEncoderBase *local_190;
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> local_188;
  undefined1 local_170 [184];
  half local_b8 [68];
  
  fVar36 = ceilf((float)this->_width * 0.125);
  local_1a0 = (pointer)CONCAT44(local_1a0._4_4_,fVar36);
  fVar36 = ceilf((float)this->_height * 0.125);
  local_1c8 = CONCAT44(local_1c8._4_4_,fVar36);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::vector
            (&local_188,
             ((long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_rowPtrs).
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_170);
  local_170._48_8_ = this->_packedAc;
  local_1b0 = &this->_dctData;
  std::
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ::resize(local_1b0,
           ((long)(this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_rowPtrs).
                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  pvVar7 = (this->_rowPtrs).
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar8 = (this->_rowPtrs).
           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->_numAcComp = 0;
  this->_numDcComp = 0;
  lVar18 = (long)pvVar7 - (long)pvVar8;
  if (lVar18 == 0) {
    iVar26 = 0;
  }
  else {
    uVar19 = (lVar18 >> 3) * -0x5555555555555555;
    uVar28 = 0;
    iVar26 = 0;
    do {
      iVar32 = 0;
      if ((this->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar28] == FLOAT) {
        iVar32 = this->_height * this->_width;
      }
      iVar26 = iVar26 + iVar32;
      uVar28 = uVar28 + 1;
    } while ((uVar28 & 0xffffffff) <= uVar19 && uVar19 - (uVar28 & 0xffffffff) != 0);
  }
  this_00 = (LossyDctEncoderBase *)local_170;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,(long)iVar26,
             (allocator_type *)&local_1d8);
  if ((this->_rowPtrs).
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_rowPtrs).
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pp_Var34 = (_func_int **)0x0;
    local_1d0 = (_func_int **)0x0;
    if (iVar26 != 0) {
      local_1d0 = (_func_int **)local_170._0_8_;
    }
    do {
      local_198 = pp_Var34;
      if (((this->_type).super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var34] == FLOAT) &&
         (0 < this->_height)) {
        local_1b8 = (pointer)((long)pp_Var34 * 3);
        local_1c0 = 0;
        do {
          iVar26 = this->_width;
          if (0 < iVar26) {
            lVar18 = *(long *)(*(long *)((long)&(((this->_rowPtrs).
                                                  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                )._M_impl.super__Vector_impl_data +
                                        (long)local_1b8 * 8) + local_1c0 * 8);
            iVar32 = 0;
            pp_Var34 = local_1d0;
            do {
              lVar33 = 0;
              do {
                *(undefined1 *)((long)&local_1d8 + lVar33) = *(undefined1 *)(lVar18 + lVar33);
                fVar36 = local_1d8;
                lVar33 = lVar33 + 1;
              } while ((int)lVar33 != 4);
              hVar14 = std::numeric_limits<half>::max();
              fVar37 = *(float *)((long)&half::_toFloat + (ulong)hVar14._h * 4);
              if (fVar37 <= fVar36) {
                fVar36 = fVar37;
              }
              hVar14 = std::numeric_limits<half>::max();
              fVar37 = *(float *)((long)&half::_toFloat + (ulong)(hVar14._h ^ 0x8000) * 4);
              if (fVar37 <= fVar36) {
                fVar37 = fVar36;
              }
              if ((fVar37 != 0.0) || (NAN(fVar37))) {
                sVar15 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar37 >> 0x17) * 2);
                if (sVar15 == 0) {
                  this_00 = (LossyDctEncoderBase *)(ulong)(uint)fVar37;
                  sVar15 = half::convert((int)fVar37);
                }
                else {
                  sVar15 = sVar15 + (short)(((uint)fVar37 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar37 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              else {
                sVar15 = (short)((uint)fVar37 >> 0x10);
              }
              lVar18 = lVar18 + lVar33;
              local_1d8 = (float)CONCAT22(local_1d8._2_2_,sVar15);
              lVar33 = 0;
              do {
                *(undefined1 *)((long)pp_Var34 + lVar33) =
                     *(undefined1 *)((long)&local_1d8 + lVar33);
                lVar33 = lVar33 + 1;
              } while ((int)lVar33 != 2);
              iVar32 = iVar32 + 1;
              iVar26 = this->_width;
              pp_Var34 = (_func_int **)((long)pp_Var34 + lVar33);
            } while (iVar32 < iVar26);
          }
          *(_func_int ***)
           (*(long *)((long)&(((this->_rowPtrs).
                               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                             _M_impl.super__Vector_impl_data + (long)local_1b8 * 8) + local_1c0 * 8)
               = local_1d0;
          local_1d0 = (_func_int **)((long)local_1d0 + (long)iVar26 * 2);
          local_1c0 = local_1c0 + 1;
        } while ((long)local_1c0 < (long)this->_height);
      }
      pp_Var34 = (_func_int **)(ulong)((int)local_198 + 1);
      pp_Var20 = (_func_int **)
                 (((long)(this->_rowPtrs).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_rowPtrs).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    } while (pp_Var34 <= pp_Var20 && (long)pp_Var20 - (long)pp_Var34 != 0);
  }
  local_1d4 = (uint)local_1a0._0_4_;
  uVar16 = (uint)(float)local_1c8;
  *local_188.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
   super__Vector_impl_data._M_start = (unsigned_short *)this->_packedDc;
  if (1 < (ulong)(((long)(this->_rowPtrs).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_rowPtrs).
                         super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    pLVar24 = (LossyDctEncoderBase *)0x1;
    pLVar29 = (LossyDctEncoderBase *)0x2;
    do {
      local_188.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
      super__Vector_impl_data._M_start[(long)pLVar24] =
           local_188.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl
           .super__Vector_impl_data._M_start[(int)pLVar29 - 2] + (int)(uVar16 * local_1d4);
      this_00 = (LossyDctEncoderBase *)
                (((long)(this->_rowPtrs).
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_rowPtrs).
                        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      bVar35 = pLVar29 <= this_00;
      lVar18 = (long)this_00 - (long)pLVar29;
      pLVar24 = pLVar29;
      pLVar29 = (LossyDctEncoderBase *)(ulong)((int)pLVar29 + 1);
    } while (bVar35 && lVar18 != 0);
  }
  if (0 < (int)uVar16) {
    local_170._24_8_ = ZEXT48(uVar16);
    local_170._32_8_ = ZEXT48(local_1d4);
    local_1a8 = (unsigned_short *)0x0;
    local_190 = this;
    do {
      if (0 < (int)local_1d4) {
        local_1c0 = (ulong)(uint)((int)local_1a8 * 8);
        local_1c8 = 0;
        pLVar24 = this;
        do {
          this = local_190;
          local_1b8 = (pLVar24->_rowPtrs).
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          pvVar7 = (pLVar24->_rowPtrs).
                   super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_170._40_8_ = (long)pvVar7 - (long)local_1b8;
          if ((pointer)local_170._40_8_ != (pointer)0x0) {
            uVar27 = (int)local_1c8 * 8;
            local_198 = (_func_int **)(((long)pvVar7 - (long)local_1b8 >> 3) * -0x5555555555555555);
            uVar16 = local_190->_width;
            this_00 = (LossyDctEncoderBase *)(ulong)uVar16;
            iVar26 = local_190->_height;
            puVar9 = local_190->_toNonlinear;
            local_1a0 = (local_190->_dctData).
                        super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            pp_Var34 = (_func_int **)0x0;
            do {
              local_1d0 = pp_Var34;
              lVar18 = *(long *)&local_1b8[(long)local_1d0].
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data;
              pfVar25 = local_1a0[(long)local_1d0]._buffer;
              lVar33 = 0;
              do {
                uVar17 = (int)local_1c0 + (int)lVar33;
                uVar22 = ~uVar17 + iVar26 * 2;
                if ((int)uVar17 < iVar26) {
                  uVar22 = uVar17;
                }
                if ((int)uVar22 < 0) {
                  uVar22 = iVar26 - 1;
                }
                lVar10 = *(long *)(lVar18 + (long)(int)uVar22 * 8);
                lVar23 = 0;
                iVar32 = ~uVar27 + uVar16 * 2;
                do {
                  iVar31 = uVar27 + (int)lVar23;
                  if ((int)uVar16 <= iVar31) {
                    iVar31 = iVar32;
                  }
                  if (iVar31 < 0) {
                    iVar31 = uVar16 - 1;
                  }
                  uVar30 = *(ushort *)(lVar10 + (long)iVar31 * 2);
                  if (puVar9 != (unsigned_short *)0x0) {
                    uVar30 = puVar9[uVar30];
                  }
                  pfVar25[lVar23] = *(float *)((long)&half::_toFloat + (ulong)uVar30 * 4);
                  lVar23 = lVar23 + 1;
                  iVar32 = iVar32 + -1;
                } while (lVar23 != 8);
                lVar33 = lVar33 + 1;
                pfVar25 = pfVar25 + 8;
              } while (lVar33 != 8);
              pp_Var34 = (_func_int **)(ulong)((int)local_1d0 + 1);
            } while (pp_Var34 < local_198);
          }
          if ((pointer)local_170._40_8_ == (pointer)0x48) {
            pSVar11 = (local_1b0->
                      super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pfVar25 = pSVar11->_buffer;
            pfVar12 = pSVar11[1]._buffer;
            pfVar13 = pSVar11[2]._buffer;
            lVar18 = 0;
            do {
              fVar36 = pfVar25[lVar18];
              fVar37 = pfVar12[lVar18];
              fVar38 = pfVar13[lVar18];
              pfVar25[lVar18] = fVar38 * 0.0722 + fVar36 * 0.2126 + fVar37 * 0.7152;
              pfVar12[lVar18] = fVar38 * 0.5 + fVar36 * -0.1146 + fVar37 * -0.3854;
              pfVar13[lVar18] = fVar38 * -0.0458 + fVar36 * 0.5 + fVar37 * -0.4542;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0x40);
          }
          if ((local_190->_rowPtrs).
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (local_190->_rowPtrs).
              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar19 = 0;
            do {
              pfVar25 = (local_1b0->
                        super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar19]._buffer;
              iVar26 = 0;
              do {
                lVar18 = 0;
                do {
                  pfVar3 = (float *)((long)pfVar25 + lVar18 + 0xe0);
                  pfVar12 = (float *)((long)pfVar25 + lVar18);
                  pfVar13 = (float *)((long)pfVar25 + lVar18 + 0x20);
                  pfVar1 = (float *)((long)pfVar25 + lVar18 + 0x40);
                  pfVar2 = (float *)((long)pfVar25 + lVar18 + 0x60);
                  fVar56 = *pfVar12 + *pfVar3;
                  fVar57 = pfVar12[1] + pfVar3[1];
                  fVar58 = pfVar12[2] + pfVar3[2];
                  fVar59 = pfVar12[3] + pfVar3[3];
                  fVar36 = *pfVar13 + *pfVar1;
                  fVar37 = pfVar13[1] + pfVar1[1];
                  fVar38 = pfVar13[2] + pfVar1[2];
                  fVar39 = pfVar13[3] + pfVar1[3];
                  pfVar4 = (float *)((long)pfVar25 + lVar18 + 0x80);
                  fVar64 = *pfVar2 + *pfVar4;
                  fVar65 = pfVar2[1] + pfVar4[1];
                  fVar66 = pfVar2[2] + pfVar4[2];
                  fVar67 = pfVar2[3] + pfVar4[3];
                  pfVar5 = (float *)((long)pfVar25 + lVar18 + 0xa0);
                  pfVar6 = (float *)((long)pfVar25 + lVar18 + 0xc0);
                  fVar44 = *pfVar12 - *pfVar3;
                  fVar45 = pfVar12[1] - pfVar3[1];
                  fVar46 = pfVar12[2] - pfVar3[2];
                  fVar47 = pfVar12[3] - pfVar3[3];
                  fVar60 = *pfVar5 + *pfVar6;
                  fVar61 = pfVar5[1] + pfVar6[1];
                  fVar62 = pfVar5[2] + pfVar6[2];
                  fVar63 = pfVar5[3] + pfVar6[3];
                  fVar52 = *pfVar13 - *pfVar1;
                  fVar53 = pfVar13[1] - pfVar1[1];
                  fVar54 = pfVar13[2] - pfVar1[2];
                  fVar55 = pfVar13[3] - pfVar1[3];
                  fVar48 = *pfVar2 - *pfVar4;
                  fVar49 = pfVar2[1] - pfVar4[1];
                  fVar50 = pfVar2[2] - pfVar4[2];
                  fVar51 = pfVar2[3] - pfVar4[3];
                  fVar40 = *pfVar5 - *pfVar6;
                  fVar41 = pfVar5[1] - pfVar6[1];
                  fVar42 = pfVar5[2] - pfVar6[2];
                  fVar43 = pfVar5[3] - pfVar6[3];
                  fVar68 = (fVar56 + fVar64) * 0.70710677;
                  fVar69 = (fVar57 + fVar65) * 0.70710677;
                  fVar70 = (fVar58 + fVar66) * 0.70710677;
                  fVar71 = (fVar59 + fVar67) * 0.70710677;
                  fVar72 = (fVar36 + fVar60) * 0.70710677;
                  fVar73 = (fVar37 + fVar61) * 0.70710677;
                  fVar74 = (fVar38 + fVar62) * 0.70710677;
                  fVar75 = (fVar39 + fVar63) * 0.70710677;
                  pfVar12 = (float *)((long)pfVar25 + lVar18);
                  *pfVar12 = (fVar68 + fVar72) * 0.5;
                  pfVar12[1] = (fVar69 + fVar73) * 0.5;
                  pfVar12[2] = (fVar70 + fVar74) * 0.5;
                  pfVar12[3] = (fVar71 + fVar75) * 0.5;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0x80);
                  *pfVar12 = (fVar68 - fVar72) * 0.5;
                  pfVar12[1] = (fVar69 - fVar73) * 0.5;
                  pfVar12[2] = (fVar70 - fVar74) * 0.5;
                  pfVar12[3] = (fVar71 - fVar75) * 0.5;
                  fVar68 = fVar52 - fVar40;
                  fVar69 = fVar53 - fVar41;
                  fVar70 = fVar54 - fVar42;
                  fVar71 = fVar55 - fVar43;
                  fVar56 = fVar56 - fVar64;
                  fVar57 = fVar57 - fVar65;
                  fVar58 = fVar58 - fVar66;
                  fVar59 = fVar59 - fVar67;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0x40);
                  *pfVar12 = fVar56 * 0.46193978 + fVar68 * 0.19134171;
                  pfVar12[1] = fVar57 * 0.46193978 + fVar69 * 0.19134171;
                  pfVar12[2] = fVar58 * 0.46193978 + fVar70 * 0.19134171;
                  pfVar12[3] = fVar59 * 0.46193978 + fVar71 * 0.19134171;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0xc0);
                  *pfVar12 = fVar56 * 0.19134171 - fVar68 * 0.46193978;
                  pfVar12[1] = fVar57 * 0.19134171 - fVar69 * 0.46193978;
                  pfVar12[2] = fVar58 * 0.19134171 - fVar70 * 0.46193978;
                  pfVar12[3] = fVar59 * 0.19134171 - fVar71 * 0.46193978;
                  fVar36 = (fVar36 - fVar60) * 0.70710677;
                  fVar37 = (fVar37 - fVar61) * 0.70710677;
                  fVar38 = (fVar38 - fVar62) * 0.70710677;
                  fVar39 = (fVar39 - fVar63) * 0.70710677;
                  fVar40 = (fVar40 + fVar52) * -0.70710677;
                  fVar41 = (fVar41 + fVar53) * -0.70710677;
                  fVar42 = (fVar42 + fVar54) * -0.70710677;
                  fVar43 = (fVar43 + fVar55) * -0.70710677;
                  fVar52 = fVar44 - fVar36;
                  fVar53 = fVar45 - fVar37;
                  fVar54 = fVar46 - fVar38;
                  fVar55 = fVar47 - fVar39;
                  fVar56 = fVar48 + fVar40;
                  fVar57 = fVar49 + fVar41;
                  fVar58 = fVar50 + fVar42;
                  fVar59 = fVar51 + fVar43;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0x60);
                  *pfVar12 = fVar52 * 0.4157348 - fVar56 * 0.27778512;
                  pfVar12[1] = fVar53 * 0.4157348 - fVar57 * 0.27778512;
                  pfVar12[2] = fVar54 * 0.4157348 - fVar58 * 0.27778512;
                  pfVar12[3] = fVar55 * 0.4157348 - fVar59 * 0.27778512;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0xa0);
                  *pfVar12 = fVar56 * 0.4157348 + fVar52 * 0.27778512;
                  pfVar12[1] = fVar57 * 0.4157348 + fVar53 * 0.27778512;
                  pfVar12[2] = fVar58 * 0.4157348 + fVar54 * 0.27778512;
                  pfVar12[3] = fVar59 * 0.4157348 + fVar55 * 0.27778512;
                  fVar36 = fVar36 + fVar44;
                  fVar37 = fVar37 + fVar45;
                  fVar38 = fVar38 + fVar46;
                  fVar39 = fVar39 + fVar47;
                  fVar40 = fVar40 - fVar48;
                  fVar41 = fVar41 - fVar49;
                  fVar42 = fVar42 - fVar50;
                  fVar43 = fVar43 - fVar51;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0x20);
                  *pfVar12 = fVar36 * 0.49039263 - fVar40 * 0.09754516;
                  pfVar12[1] = fVar37 * 0.49039263 - fVar41 * 0.09754516;
                  pfVar12[2] = fVar38 * 0.49039263 - fVar42 * 0.09754516;
                  pfVar12[3] = fVar39 * 0.49039263 - fVar43 * 0.09754516;
                  pfVar12 = (float *)((long)pfVar25 + lVar18 + 0xe0);
                  *pfVar12 = fVar40 * 0.49039263 + fVar36 * 0.09754516;
                  pfVar12[1] = fVar41 * 0.49039263 + fVar37 * 0.09754516;
                  pfVar12[2] = fVar42 * 0.49039263 + fVar38 * 0.09754516;
                  pfVar12[3] = fVar43 * 0.49039263 + fVar39 * 0.09754516;
                  lVar18 = lVar18 + 0x10;
                } while (lVar18 == 0x10);
                fVar36 = pfVar25[1];
                fVar37 = pfVar25[2];
                fVar38 = pfVar25[3];
                fVar39 = pfVar25[0xb];
                fVar40 = pfVar25[0x11];
                fVar41 = pfVar25[0x13];
                fVar42 = pfVar25[0x25];
                fVar43 = pfVar25[0x26];
                fVar44 = pfVar25[0x27];
                fVar45 = pfVar25[0x2f];
                fVar46 = pfVar25[0x35];
                fVar47 = pfVar25[0x37];
                *pfVar25 = *pfVar25;
                pfVar25[1] = pfVar25[8];
                pfVar25[2] = pfVar25[0x10];
                pfVar25[3] = pfVar25[0x18];
                pfVar25[0x10] = fVar37;
                pfVar25[0x11] = pfVar25[10];
                pfVar25[0x12] = pfVar25[0x12];
                pfVar25[0x13] = pfVar25[0x1a];
                pfVar25[8] = fVar36;
                pfVar25[9] = pfVar25[9];
                pfVar25[10] = fVar40;
                pfVar25[0xb] = pfVar25[0x19];
                pfVar25[0x18] = fVar38;
                pfVar25[0x19] = fVar39;
                pfVar25[0x1a] = fVar41;
                pfVar25[0x1b] = pfVar25[0x1b];
                pfVar25[0x24] = pfVar25[0x24];
                pfVar25[0x25] = pfVar25[0x2c];
                pfVar25[0x26] = pfVar25[0x34];
                pfVar25[0x27] = pfVar25[0x3c];
                pfVar25[0x34] = fVar43;
                pfVar25[0x35] = pfVar25[0x2e];
                pfVar25[0x36] = pfVar25[0x36];
                pfVar25[0x37] = pfVar25[0x3e];
                pfVar25[0x2c] = fVar42;
                pfVar25[0x2d] = pfVar25[0x2d];
                pfVar25[0x2e] = fVar46;
                pfVar25[0x2f] = pfVar25[0x3d];
                pfVar25[0x3c] = fVar44;
                pfVar25[0x3d] = fVar45;
                pfVar25[0x3e] = fVar47;
                pfVar25[0x3f] = pfVar25[0x3f];
                fVar36 = pfVar25[0x20];
                fVar37 = pfVar25[0x21];
                fVar38 = pfVar25[0x22];
                fVar39 = pfVar25[0x23];
                fVar40 = pfVar25[0x28];
                fVar41 = pfVar25[0x29];
                fVar42 = pfVar25[0x2a];
                fVar43 = pfVar25[0x2b];
                fVar44 = pfVar25[0x30];
                fVar45 = pfVar25[0x31];
                fVar46 = pfVar25[0x32];
                fVar47 = pfVar25[0x33];
                fVar48 = pfVar25[0x38];
                fVar49 = pfVar25[0x39];
                fVar50 = pfVar25[0x3a];
                fVar51 = pfVar25[0x3b];
                pfVar25[0x20] = pfVar25[4];
                pfVar25[0x21] = pfVar25[0xc];
                pfVar25[0x22] = pfVar25[0x14];
                pfVar25[0x23] = pfVar25[0x1c];
                pfVar25[0x30] = pfVar25[6];
                pfVar25[0x31] = pfVar25[0xe];
                pfVar25[0x32] = pfVar25[0x16];
                pfVar25[0x33] = pfVar25[0x1e];
                pfVar25[0x28] = pfVar25[5];
                pfVar25[0x29] = pfVar25[0xd];
                pfVar25[0x2a] = pfVar25[0x15];
                pfVar25[0x2b] = pfVar25[0x1d];
                pfVar25[0x38] = pfVar25[7];
                pfVar25[0x39] = pfVar25[0xf];
                pfVar25[0x3a] = pfVar25[0x17];
                pfVar25[0x3b] = pfVar25[0x1f];
                pfVar25[4] = fVar36;
                pfVar25[5] = fVar40;
                pfVar25[6] = fVar44;
                pfVar25[7] = fVar48;
                pfVar25[0x14] = fVar38;
                pfVar25[0x15] = fVar42;
                pfVar25[0x16] = fVar46;
                pfVar25[0x17] = fVar50;
                pfVar25[0xc] = fVar37;
                pfVar25[0xd] = fVar41;
                pfVar25[0xe] = fVar45;
                pfVar25[0xf] = fVar49;
                pfVar25[0x1c] = fVar39;
                pfVar25[0x1d] = fVar43;
                pfVar25[0x1e] = fVar47;
                pfVar25[0x1f] = fVar51;
                bVar35 = iVar26 == 0;
                iVar26 = iVar26 + 1;
              } while (bVar35);
              lVar18 = 0;
              if ((int)uVar19 == 0) {
                do {
                  fVar36 = (local_1b0->
                           super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar19]._buffer[lVar18];
                  if ((fVar36 != 0.0) || (NAN(fVar36))) {
                    sVar15 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                    if (sVar15 == 0) {
                      this_00 = (LossyDctEncoderBase *)(ulong)(uint)fVar36;
                      hVar14._h = half::convert((int)fVar36);
                    }
                    else {
                      hVar14._h = sVar15 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                                   (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    hVar14._h = (unsigned_short)((uint)fVar36 >> 0x10);
                  }
                  hVar14 = quantize(this_00,hVar14,
                                    this->_quantBaseError * this->_quantTableY[lVar18]);
                  local_b8[lVar18 + -0x40]._h = hVar14._h;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x40);
              }
              else {
                do {
                  fVar36 = (local_1b0->
                           super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar19]._buffer[lVar18];
                  if ((fVar36 != 0.0) || (NAN(fVar36))) {
                    sVar15 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
                    if (sVar15 == 0) {
                      this_00 = (LossyDctEncoderBase *)(ulong)(uint)fVar36;
                      hVar14._h = half::convert((int)fVar36);
                    }
                    else {
                      hVar14._h = sVar15 + (short)(((uint)fVar36 & 0x7fffff) + 0xfff +
                                                   (uint)(((uint)fVar36 >> 0xd & 1) != 0) >> 0xd);
                    }
                  }
                  else {
                    hVar14._h = (unsigned_short)((uint)fVar36 >> 0x10);
                  }
                  hVar14 = quantize(this_00,hVar14,
                                    this->_quantBaseError * this->_quantTableCbCr[lVar18]);
                  local_b8[lVar18 + -0x40]._h = hVar14._h;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x40);
              }
              phVar21 = local_b8;
              lVar18 = 0;
              do {
                phVar21->_h = local_b8[(long)*(int *)((long)
                                                  L"8ccccc/Bcccccccccccccccccccccccccccccccccccccc"
                                                  + lVar18 + 0xb8) + -0x40]._h;
                lVar18 = lVar18 + 4;
                phVar21 = phVar21 + 1;
              } while (lVar18 != 0x100);
              puVar9 = local_188.
                       super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar19];
              local_188.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar19] = puVar9 + 1;
              *puVar9 = local_b8[0]._h;
              this->_numDcComp = this->_numDcComp + 1;
              this_00 = this;
              rleAc(this,local_b8,(unsigned_short **)(local_170 + 0x30));
              uVar19 = (ulong)((int)uVar19 + 1);
              uVar28 = ((long)(this->_rowPtrs).
                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_rowPtrs).
                              super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
            } while (uVar19 <= uVar28 && uVar28 - uVar19 != 0);
          }
          local_1c8 = local_1c8 + 1;
          pLVar24 = this;
        } while (local_1c8 != local_170._32_8_);
      }
      local_1a8 = (unsigned_short *)((long)local_1a8 + 1);
    } while (local_1a8 != (unsigned_short *)local_170._24_8_);
  }
  if ((_func_int **)local_170._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ - local_170._0_8_);
  }
  if (local_188.super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<unsigned_short_*,_std::allocator<unsigned_short_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::execute ()
{
    int  numBlocksX   = (int)ceil ((float)_width / 8.0f);
    int  numBlocksY   = (int)ceil ((float)_height/ 8.0f);

    half halfZigCoef[64]; 
    half halfCoef[64];

    std::vector<unsigned short *> currDcComp (_rowPtrs.size());
    unsigned short               *currAcComp = (unsigned short *)_packedAc;

    _dctData.resize (_rowPtrs.size());
    _numAcComp = 0;
    _numDcComp = 0;
 
    assert (_type.size() == _rowPtrs.size());
    assert ((_rowPtrs.size() == 3) || (_rowPtrs.size() == 1));

    // 
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
        if (_type[chan] == FLOAT)
            tmpHalfBufferElements += _width * _height;

    std::vector<unsigned short> tmpHalfBuffer (tmpHalfBufferElements);

    char *tmpHalfBufferPtr = 0;

    if (tmpHalfBufferElements)
        tmpHalfBufferPtr = (char *)&tmpHalfBuffer[0];

    //
    // Run over all the float scanlines, quantizing, 
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
    {
        if (_type[chan] != FLOAT)
            continue;
    
        for (int y = 0; y < _height; ++y)
        {
            float       src = 0;
            const char *srcXdr = _rowPtrs[chan][y];
            char       *dstXdr = tmpHalfBufferPtr;
           
            for (int x = 0; x < _width; ++x)
            {

                Xdr::read<CharPtrIO> (srcXdr, src);

                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                src = std::max (
                    std::min ((float) std::numeric_limits<half>::max(), src),
                              (float)-std::numeric_limits<half>::max());

                Xdr::write<CharPtrIO> (dstXdr, ((half)src).bits());

                //
                // Xdr::read and Xdr::write will advance the ptr
                //
            }

            _rowPtrs[chan][y] = (const char *)tmpHalfBufferPtr;
            tmpHalfBufferPtr += _width * sizeof (unsigned short);
        }
    }

    //
    // Pack DC components together by common plane, so we can get 
    // a little more out of differencing them. We'll always have 
    // one component per block, so we can computed offsets.
    //

    currDcComp[0] = (unsigned short *)_packedDc;

    for (unsigned int chan = 1; chan < _rowPtrs.size(); ++chan)
        currDcComp[chan] = currDcComp[chan-1] + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            half           h;
            unsigned short tmpShortXdr, tmpShortNative;
            char          *tmpCharPtr;

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= _width)
                            vx = _width - (vx - (_width - 1));
                        
                        if (vx < 0) vx = _width-1;

                        if (vy >=_height)
                            vy = _height - (vy - (_height - 1));

                        if (vy < 0) vy = _height-1;
                    
                        tmpShortXdr =
                            ((const unsigned short *)(_rowPtrs[chan])[vy])[vx];

                        if (_toNonlinear)
                        {
                            h.setBits (_toNonlinear[tmpShortXdr]);
                        }
                        else
                        {
                            const char *tmpConstCharPtr =
                                (const char *)(&tmpShortXdr);

                            Xdr::read<CharPtrIO>
                                (tmpConstCharPtr, tmpShortNative);

                            h.setBits(tmpShortNative);
                        }

                        _dctData[chan]._buffer[y * 8 + x] = (float)h;
                    } // x
                } // y
            } // chan

            //
            // Color space conversion
            //

            if (_rowPtrs.size() == 3)
            {
                csc709Forward64 (_dctData[0]._buffer, 
                                 _dctData[1]._buffer, 
                                 _dctData[2]._buffer);
            }

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Forward DCT
                //

                dctForward8x8(_dctData[chan]._buffer);

                //
                // Quantize to half, and zigzag
                //

                if (chan == 0)
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableY[i]);
                    }
                }
                else
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableCbCr[i]);
                    }
                }

                toZigZag (halfZigCoef, halfCoef);
                
                //
                // Convert from NATIVE back to XDR, before we write out
                //

                for (int i = 0; i < 64; ++i)
                {
                    tmpCharPtr = (char *)&tmpShortXdr;
                    Xdr::write<CharPtrIO>(tmpCharPtr, halfZigCoef[i].bits());
                    halfZigCoef[i].setBits(tmpShortXdr);
                }

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *currDcComp[chan]++ = halfZigCoef[0].bits();
                _numDcComp++;
                
                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                rleAc (halfZigCoef, currAcComp);
            } // chan
        } // blockx
    } // blocky              
}